

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

SubtreeArray ts_stack_pop_error(Stack *self,StackVersion version)

{
  uint32_t *puVar1;
  short sVar2;
  uint32_t uVar3;
  uint uVar4;
  StackIterator *pSVar5;
  StackSlice *pSVar6;
  short *psVar7;
  long lVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  SubtreeArray self_00;
  undefined8 uVar15;
  undefined4 uVar16;
  byte bVar17;
  uint uVar18;
  Subtree *pSVar19;
  StackIterator *pSVar20;
  SubtreeHeapData *pSVar21;
  void *pvVar22;
  long lVar23;
  Subtree *pSVar24;
  long lVar25;
  uint extraout_EDX;
  Subtree *in_RDX;
  Subtree *extraout_RDX;
  Subtree *extraout_RDX_00;
  Subtree *extraout_RDX_01;
  Subtree *extraout_RDX_02;
  uint uVar26;
  SubtreeArray *pSVar27;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  undefined8 extraout_RDX_05;
  uint uVar28;
  uint uVar29;
  _Bool *p_Var30;
  undefined8 uVar31;
  Stack *pSVar32;
  Subtree SVar33;
  long *__size;
  byte *pbVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  Stack *self_01;
  Stack *__size_00;
  long *__size_01;
  uint32_t uVar38;
  uint uVar39;
  StackNode *pSVar40;
  undefined8 *puVar41;
  StackNode *pSVar42;
  ulong uVar43;
  bool bVar44;
  bool bVar45;
  SubtreeArray SVar46;
  SubtreeArray SVar47;
  SubtreeArray SVar48;
  SubtreeArray SVar49;
  SubtreeArray subtrees;
  byte bStack_111;
  undefined1 auStack_f0 [16];
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  ulong uStack_d0;
  StackNode *pSStack_c8;
  Stack *pSStack_c0;
  Stack *pSStack_b8;
  ulong uStack_b0;
  Subtree *pSStack_a8;
  Stack *pSStack_a0;
  byte local_8d;
  uint local_8c;
  StackNode *local_88;
  uint local_7c;
  Stack *local_78;
  long local_70;
  StackVersion local_64;
  ulong local_60;
  SubtreeArray local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((self->heads).size <= version) {
LAB_001305ef:
    pSStack_a0 = (Stack *)0x13060e;
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x206,"SubtreeArray ts_stack_pop_error(Stack *, StackVersion)");
  }
  pSVar42 = (self->heads).contents[version].node;
  pSVar19 = (Subtree *)(ulong)pSVar42->link_count;
  bVar44 = true;
  if (pSVar19 != (Subtree *)0x0) {
    pSVar19 = (Subtree *)((ulong)pSVar42->link_count * 0x18);
    pSVar24 = (Subtree *)0x0;
    while (((in_RDX = *(Subtree **)((long)&pSVar42->links[0].subtree + (long)pSVar24),
            in_RDX == (Subtree *)0x0 || (((ulong)in_RDX & 1) != 0)) ||
           (*(short *)(in_RDX + 5) != -1))) {
      pSVar24 = pSVar24 + 3;
      if (pSVar19 == pSVar24) goto LAB_001300b7;
    }
    (self->slices).size = 0;
    (self->iterators).size = 0;
    pSStack_a0 = (Stack *)0x1300ec;
    pSVar19 = (Subtree *)calloc(1,8);
    if (pSVar19 == (Subtree *)0x0) {
      pSStack_a0 = (Stack *)0x130613;
      ts_stack_pop_error_cold_7();
      goto LAB_00130613;
    }
    uVar18 = (self->iterators).capacity;
    if ((self->iterators).size == uVar18) {
      pSVar32 = (Stack *)0x8;
      if (8 < uVar18 * 2) {
        pSVar32 = (Stack *)(ulong)(uVar18 * 2);
      }
      if (uVar18 < (uint)pSVar32) {
        uVar36 = (ulong)version;
        pSVar20 = (self->iterators).contents;
        __size_00 = pSVar32;
        if (pSVar20 == (StackIterator *)0x0) {
LAB_0013013c:
          uVar35 = 0x20;
          pSStack_a0 = (Stack *)0x130149;
          pSVar20 = (StackIterator *)calloc((size_t)__size_00,0x20);
          if (pSVar20 == (StackIterator *)0x0) {
            pSStack_a0 = (Stack *)ts_stack_pop_all;
            self_01 = __size_00;
            ts_stack_pop_error_cold_6();
            (self_01->slices).size = 0;
            (self_01->iterators).size = 0;
            pSStack_c8 = pSVar42;
            pSStack_c0 = __size_00;
            pSStack_b8 = self;
            uStack_b0 = uVar36;
            pSStack_a8 = pSVar19;
            pSStack_a0 = pSVar32;
            if ((self_01->heads).size <= (uint)uVar35) {
              __assert_fail("(uint32_t)version < (&self->heads)->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                            ,0x118,
                            "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                           );
            }
            pSVar42 = (self_01->heads).contents[uVar35 & 0xffffffff].node;
            uVar18 = (self_01->iterators).capacity;
            if ((self_01->iterators).size != uVar18) goto LAB_001306cd;
            __size = (long *)0x8;
            if (8 < uVar18 * 2) {
              __size = (long *)(ulong)(uVar18 * 2);
            }
            uVar26 = (uint)__size;
            if (uVar26 <= uVar18) goto LAB_001306cd;
            pSVar20 = (self_01->iterators).contents;
            if (pSVar20 == (StackIterator *)0x0) {
LAB_001306ad:
              uVar36 = 0x20;
              pSVar20 = (StackIterator *)calloc((size_t)__size,0x20);
              if (pSVar20 == (StackIterator *)0x0) {
                ts_stack_pop_all_cold_6();
                pSVar21 = (SubtreeHeapData *)malloc(0x10);
                if (pSVar21 == (SubtreeHeapData *)0x0) goto LAB_00130f9e;
                pSVar21->ref_count = 0;
                (pSVar21->padding).bytes = 0;
                (pSVar21->padding).extent.row = 0;
                (pSVar21->padding).extent.column = 0;
                *(undefined4 *)(__size + 3) = 0;
                *(undefined4 *)(__size + 5) = 0;
                if (*(uint *)(__size + 1) <= (uint)uVar36) goto LAB_00130fa3;
                uVar31 = *(undefined8 *)(*__size + (uVar36 & 0xffffffff) * 0x28);
                uVar18 = *(uint *)((long)__size + 0x2c);
                if (*(uint *)(__size + 5) == uVar18) {
                  uVar26 = 8;
                  if (8 < uVar18 * 2) {
                    uVar26 = uVar18 * 2;
                  }
                  if (uVar18 < uVar26) {
                    __size_01 = (long *)(ulong)uVar26;
                    if ((void *)__size[4] == (void *)0x0) {
LAB_00130b5d:
                      uVar18 = 0x20;
                      pvVar22 = calloc((size_t)__size_01,0x20);
                      if (pvVar22 == (void *)0x0) goto LAB_00130fcc;
                    }
                    else {
                      __size_01 = (long *)((long)__size_01 << 5);
                      pvVar22 = realloc((void *)__size[4],(size_t)__size_01);
                      if (pvVar22 == (void *)0x0) {
                        ts_stack_record_summary_cold_1();
                        goto LAB_00130b5d;
                      }
                    }
                    __size[4] = (long)pvVar22;
                    *(uint *)((long)__size + 0x2c) = uVar26;
                  }
                }
                lVar23 = __size[4];
                uVar18 = *(uint *)(__size + 5);
                uVar26 = uVar18 + 1;
                uVar35 = (ulong)uVar26;
                *(uint *)(__size + 5) = uVar26;
                lVar25 = (ulong)uVar18 * 0x20;
                *(undefined8 *)(lVar23 + lVar25) = uVar31;
                puVar41 = (undefined8 *)(lVar23 + 8 + lVar25);
                *puVar41 = 0;
                puVar41[1] = 0;
                *(undefined4 *)(lVar23 + 0x18 + lVar25) = 0;
                *(undefined1 *)(lVar23 + 0x1c + lVar25) = 1;
                uVar26 = *(uint *)(__size + 5);
                if (uVar26 == 0) goto LAB_00130f26;
                uVar37 = 0;
                goto LAB_00130bc8;
              }
            }
            else {
              __size = (long *)((long)__size << 5);
              pSVar20 = (StackIterator *)realloc(pSVar20,(size_t)__size);
              if (pSVar20 == (StackIterator *)0x0) {
                ts_stack_pop_all_cold_1();
                goto LAB_001306ad;
              }
            }
            (self_01->iterators).contents = pSVar20;
            (self_01->iterators).capacity = uVar26;
LAB_001306cd:
            pSVar20 = (self_01->iterators).contents;
            uVar18 = (self_01->iterators).size;
            (self_01->iterators).size = uVar18 + 1;
            pSVar20[uVar18].node = pSVar42;
            pSVar27 = &pSVar20[uVar18].subtrees;
            pSVar27->contents = (Subtree *)0x0;
            pSVar27->size = 0;
            pSVar27->capacity = 0;
            pSVar20[uVar18].subtree_count = 0;
            pSVar20[uVar18].is_pending = true;
            uVar38 = (self_01->iterators).size;
            if (uVar38 != 0) {
              uVar36 = 0;
              do {
                do {
                  pSVar20 = (self_01->iterators).contents;
                  pSVar42 = pSVar20[uVar36].node;
                  if (pSVar42->link_count == 0) {
                    auStack_f0._0_8_ = pSVar20[uVar36].subtrees.contents;
                    pSVar19 = *(Subtree **)&pSVar20[uVar36].subtrees.size;
                    auStack_f0._8_4_ = SUB84(pSVar19,0);
                    if (1 < (uint)auStack_f0._8_4_) {
                      uVar18 = (uint)auStack_f0._8_4_ >> 1;
                      uVar37 = 0;
                      do {
                        auStack_f0._8_4_ = auStack_f0._8_4_ - 1;
                        SVar33 = *(Subtree *)(auStack_f0._0_8_ + uVar37 * 8);
                        *(Subtree *)(auStack_f0._0_8_ + uVar37 * 8) =
                             *(Subtree *)(auStack_f0._0_8_ + (ulong)(uint)auStack_f0._8_4_ * 8);
                        *(Subtree *)(auStack_f0._0_8_ + (ulong)(uint)auStack_f0._8_4_ * 8) = SVar33;
                        uVar37 = uVar37 + 1;
                      } while (uVar18 != uVar37);
                    }
                    auStack_f0._8_8_ = pSVar19;
                    ts_stack__add_slice(self_01,(uint)uVar35,pSVar42,(SubtreeArray *)auStack_f0);
                    uVar18 = (self_01->iterators).size;
                    if (uVar18 <= (uint)uVar36) {
LAB_00130a7a:
                      __assert_fail("index < self->size",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                                    ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
                    }
                    pSVar20 = (self_01->iterators).contents;
                    memmove(pSVar20 + uVar36,pSVar20 + uVar36 + 1,
                            (ulong)(uVar18 + ~(uint)uVar36) << 5);
                    puVar1 = &(self_01->iterators).size;
                    *puVar1 = *puVar1 - 1;
                    uVar38 = uVar38 - 1;
                  }
                  else {
                    uVar37 = (ulong)pSVar42->link_count;
                    uStack_d0 = uVar36;
                    if (pSVar42->link_count != 0) {
                      p_Var30 = &pSVar42->links[1].is_pending;
                      uVar43 = 0;
                      do {
                        uVar43 = uVar43 + 1;
                        if (uVar43 == uVar37) {
                          pSVar40 = pSVar42->links[0].node;
                          SVar33 = pSVar42->links[0].subtree;
                          bStack_111 = pSVar42->links[0].is_pending;
                          pSVar20 = (self_01->iterators).contents + uVar36;
LAB_001308e9:
                          pSVar20->node = pSVar40;
                          if (SVar33.ptr == (SubtreeHeapData *)0x0) {
                            pSVar20->subtree_count = pSVar20->subtree_count + 1;
                          }
                          else {
                            uVar18 = (pSVar20->subtrees).capacity;
                            if ((pSVar20->subtrees).size == uVar18) {
                              uVar26 = uVar18 * 2;
                              if (uVar26 < 9) {
                                uVar26 = 8;
                              }
                              if (uVar18 < uVar26) {
                                pSVar19 = (pSVar20->subtrees).contents;
                                if (pSVar19 == (Subtree *)0x0) {
                                  pSVar19 = (Subtree *)calloc((ulong)uVar26,8);
                                  if (pSVar19 != (Subtree *)0x0) goto LAB_0013094b;
                                }
                                else {
                                  pSVar19 = (Subtree *)realloc(pSVar19,(ulong)uVar26 << 3);
                                  if (pSVar19 != (Subtree *)0x0) {
LAB_0013094b:
                                    (pSVar20->subtrees).contents = pSVar19;
                                    (pSVar20->subtrees).capacity = uVar26;
                                    goto LAB_00130953;
                                  }
                                  ts_stack_pop_all_cold_4();
                                }
                                ts_stack_pop_all_cold_5();
LAB_00130a6a:
                                ts_stack_pop_all_cold_2();
                                goto LAB_00130a72;
                              }
                            }
LAB_00130953:
                            uVar18 = (pSVar20->subtrees).size;
                            (pSVar20->subtrees).size = uVar18 + 1;
                            (pSVar20->subtrees).contents[uVar18] = SVar33;
                            ts_subtree_retain(SVar33);
                            if (((ulong)SVar33.ptr & 1) == 0) {
                              uVar18 = *(uint *)&(SVar33.ptr)->field_0x2c >> 2;
                            }
                            else {
                              uVar18 = (uint)((ulong)SVar33.ptr >> 3) & 0x1fffffff;
                            }
                            if (((uVar18 & 1) != 0) ||
                               (pSVar20->subtree_count = pSVar20->subtree_count + 1,
                               (bStack_111 & 1) != 0)) goto LAB_001309a1;
                          }
                          pSVar20->is_pending = false;
                        }
                        else if ((self_01->iterators).size < 0x40) {
                          pSVar40 = ((StackLink *)(p_Var30 + -0x10))->node;
                          SVar33 = *(Subtree *)(p_Var30 + -8);
                          bStack_111 = *p_Var30;
                          pSVar20 = (self_01->iterators).contents;
                          auStack_f0._0_8_ = pSVar20[uVar36].node;
                          auStack_f0._8_8_ = pSVar20[uVar36].subtrees.contents;
                          pSVar27 = &pSVar20[uVar36].subtrees;
                          uStack_e0._0_4_ = pSVar27->size;
                          uStack_e0._4_4_ = pSVar27->capacity;
                          uStack_d8 = pSVar27[1].contents;
                          uVar18 = (self_01->iterators).capacity;
                          if ((self_01->iterators).size != uVar18) {
LAB_00130886:
                            pSVar20 = (self_01->iterators).contents;
                            uVar18 = (self_01->iterators).size;
                            (self_01->iterators).size = uVar18 + 1;
                            pSVar5 = pSVar20 + uVar18;
                            (pSVar5->subtrees).size = (undefined4)uStack_e0;
                            (pSVar5->subtrees).capacity = uStack_e0._4_4_;
                            *(undefined8 *)(&(pSVar5->subtrees).size + 2) = uStack_d8;
                            pSVar20 = pSVar20 + uVar18;
                            pSVar20->node = (StackNode *)auStack_f0._0_8_;
                            (pSVar20->subtrees).contents = (Subtree *)auStack_f0._8_8_;
                            uVar3 = (self_01->iterators).size;
                            if (uVar3 == 0) {
                              __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                            ,0x151,
                                            "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                                           );
                            }
                            uVar18 = uVar3 - 1;
                            pSVar5 = (self_01->iterators).contents;
                            pSVar20 = pSVar5 + uVar18;
                            pSVar27 = &pSVar5[uVar18].subtrees;
                            ts_subtree_array_copy(*pSVar27,pSVar27);
                            goto LAB_001308e9;
                          }
                          uVar26 = uVar18 * 2;
                          if (uVar26 < 9) {
                            uVar26 = 8;
                          }
                          if (uVar26 <= uVar18) goto LAB_00130886;
                          if (pSVar20 != (StackIterator *)0x0) {
                            pSVar20 = (StackIterator *)realloc(pSVar20,(ulong)uVar26 << 5);
                            if (pSVar20 != (StackIterator *)0x0) goto LAB_00130879;
                            goto LAB_00130a6a;
                          }
                          pSVar20 = (StackIterator *)calloc((ulong)uVar26,0x20);
                          if (pSVar20 != (StackIterator *)0x0) {
LAB_00130879:
                            (self_01->iterators).contents = pSVar20;
                            (self_01->iterators).capacity = uVar26;
                            goto LAB_00130886;
                          }
LAB_00130a72:
                          ts_stack_pop_all_cold_3();
                          goto LAB_00130a7a;
                        }
LAB_001309a1:
                        uVar37 = (ulong)pSVar42->link_count;
                        p_Var30 = p_Var30 + 0x18;
                      } while (uVar43 < uVar37);
                    }
                    uVar36 = (ulong)((int)uStack_d0 + 1);
                  }
                } while ((uint)uVar36 < uVar38);
                uVar38 = (self_01->iterators).size;
                uVar36 = 0;
              } while (uVar38 != 0);
            }
            SVar47.contents = (Subtree *)(self_01->slices).contents;
            SVar47.size = (self_01->slices).size;
            SVar47.capacity = (self_01->slices).capacity;
            return SVar47;
          }
        }
        else {
          __size_00 = (Stack *)((long)pSVar32 << 5);
          pSStack_a0 = (Stack *)0x13012f;
          pSVar20 = (StackIterator *)realloc(pSVar20,(size_t)__size_00);
          if (pSVar20 == (StackIterator *)0x0) {
            pSStack_a0 = (Stack *)0x13013c;
            ts_stack_pop_error_cold_1();
            goto LAB_0013013c;
          }
        }
        (self->iterators).contents = pSVar20;
        (self->iterators).capacity = (uint)pSVar32;
      }
    }
    pSVar20 = (self->iterators).contents;
    uVar18 = (self->iterators).size;
    (self->iterators).size = uVar18 + 1;
    pSVar20[uVar18].node = pSVar42;
    pSVar20[uVar18].subtrees.contents = pSVar19;
    in_RDX = (Subtree *)0x100000000;
    pSVar20[uVar18].subtrees.size = 0;
    pSVar20[uVar18].subtrees.capacity = 1;
    pSVar20[uVar18].subtree_count = 0;
    pSVar20[uVar18].is_pending = true;
    uVar18 = (self->iterators).size;
    if (uVar18 != 0) {
      uVar36 = 0;
      local_8c = 0;
      local_78 = self;
      local_64 = version;
      do {
        do {
          pSVar20 = (self->iterators).contents;
          uVar35 = uVar36 & 0xffffffff;
          local_70 = uVar35 * 0x20;
          pSVar27 = &pSVar20[uVar35].subtrees;
          if (pSVar20[uVar35].subtrees.size == 0) {
            bVar17 = 0;
          }
          else {
            bVar17 = 1;
            if ((local_8c & 1) == 0) {
              if (((ulong)pSVar27->contents->ptr & 1) == 0) {
                bVar44 = pSVar27->contents->ptr->symbol == 0xffff;
              }
              else {
                bVar44 = false;
              }
              in_RDX = (Subtree *)0x1;
              local_8c = local_8c & 0xff;
              if (bVar44 != false) {
                local_8c = 1;
              }
              bVar17 = bVar44 * '\x02' + 1;
            }
          }
          local_88 = pSVar20[uVar35].node;
          bVar44 = true;
          if ((bVar17 & 1) == 0) {
            bVar44 = local_88->link_count == 0;
          }
          local_7c = uVar18;
          local_60 = uVar36;
          if (1 < bVar17) {
            local_58.contents = pSVar27->contents;
            uVar9 = pSVar20[uVar35].subtrees.size;
            uVar10 = pSVar20[uVar35].subtrees.capacity;
            uVar15 = pSVar27->contents;
            uVar16 = pSVar27->size;
            self_00.size = uVar16;
            self_00.contents = (Subtree *)uVar15;
            local_58.size = uVar9;
            local_58.capacity = uVar10;
            if (!bVar44) {
              self_00.capacity = uVar10;
              pSStack_a0 = (Stack *)0x13027b;
              ts_subtree_array_copy(self_00,&local_58);
            }
            if (1 < local_58.size) {
              uVar36 = 0;
              uVar18 = local_58.size;
              do {
                uVar18 = uVar18 - 1;
                SVar33 = local_58.contents[uVar36];
                local_58.contents[uVar36] = local_58.contents[uVar18];
                local_58.contents[uVar18] = SVar33;
                uVar36 = uVar36 + 1;
              } while (local_58.size >> 1 != uVar36);
            }
            pSStack_a0 = (Stack *)0x1302c3;
            ts_stack__add_slice(self,version,local_88,&local_58);
            in_RDX = extraout_RDX;
          }
          if (bVar44) {
            if (bVar17 < 2) {
              pSStack_a0 = (Stack *)0x1302da;
              ts_subtree_array_delete(self->subtree_pool,pSVar27);
            }
            uVar36 = local_60;
            uVar18 = (self->iterators).size;
            if (uVar18 <= (uint)local_60) {
LAB_001305b8:
              pSStack_a0 = (Stack *)0x1305d7;
              __assert_fail("index < self->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                            ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
            }
            pSVar20 = (self->iterators).contents;
            pSStack_a0 = (Stack *)0x130314;
            memmove((void *)((long)&pSVar20->node + local_70),pSVar20 + uVar35 + 1,
                    (ulong)(uVar18 + ~(uint)local_60) << 5);
            puVar1 = &(self->iterators).size;
            *puVar1 = *puVar1 - 1;
            in_RDX = extraout_RDX_00;
            uVar18 = local_7c - 1;
          }
          else {
            uVar36 = (ulong)local_88->link_count;
            if (local_88->link_count != 0) {
              p_Var30 = &local_88->links[1].is_pending;
              uVar35 = 0;
              do {
                uVar35 = uVar35 + 1;
                if (uVar35 == uVar36) {
                  pSVar42 = local_88->links[0].node;
                  SVar33 = local_88->links[0].subtree;
                  local_8d = local_88->links[0].is_pending;
                  pSVar20 = (StackIterator *)((long)&((self->iterators).contents)->node + local_70);
LAB_00130460:
                  pSVar20->node = pSVar42;
                  if (SVar33.ptr == (SubtreeHeapData *)0x0) {
                    pSVar20->subtree_count = pSVar20->subtree_count + 1;
                  }
                  else {
                    uVar18 = (pSVar20->subtrees).capacity;
                    if ((pSVar20->subtrees).size == uVar18) {
                      uVar26 = uVar18 * 2;
                      if (uVar26 < 9) {
                        uVar26 = 8;
                      }
                      if (uVar18 < uVar26) {
                        pSVar19 = (pSVar20->subtrees).contents;
                        if (pSVar19 == (Subtree *)0x0) {
                          pSStack_a0 = (Stack *)0x1304bc;
                          pSVar19 = (Subtree *)calloc((ulong)uVar26,8);
                          if (pSVar19 == (Subtree *)0x0) {
                            pSStack_a0 = (Stack *)0x1305df;
                            ts_stack_pop_error_cold_5();
                            goto LAB_001305df;
                          }
                        }
                        else {
                          pSStack_a0 = (Stack *)0x13049f;
                          pSVar19 = (Subtree *)realloc(pSVar19,(ulong)uVar26 << 3);
                          if (pSVar19 == (Subtree *)0x0) {
                            pSStack_a0 = (Stack *)0x1305b8;
                            ts_stack_pop_error_cold_4();
                            goto LAB_001305b8;
                          }
                        }
                        (pSVar20->subtrees).contents = pSVar19;
                        (pSVar20->subtrees).capacity = uVar26;
                      }
                    }
                    uVar18 = (pSVar20->subtrees).size;
                    (pSVar20->subtrees).size = uVar18 + 1;
                    (pSVar20->subtrees).contents[uVar18] = SVar33;
                    pSStack_a0 = (Stack *)0x1304e8;
                    ts_subtree_retain(SVar33);
                    if (((ulong)SVar33.ptr & 1) == 0) {
                      uVar18 = *(uint *)&(SVar33.ptr)->field_0x2c >> 2;
                    }
                    else {
                      uVar18 = (uint)((ulong)SVar33.ptr >> 3) & 0x1fffffff;
                    }
                    in_RDX = extraout_RDX_02;
                    self = local_78;
                    if (((uVar18 & 1) != 0) ||
                       (pSVar20->subtree_count = pSVar20->subtree_count + 1, (local_8d & 1) != 0))
                    goto LAB_00130515;
                  }
                  pSVar20->is_pending = false;
                }
                else if ((self->iterators).size < 0x40) {
                  pSVar42 = ((StackLink *)(p_Var30 + -0x10))->node;
                  SVar33 = *(Subtree *)(p_Var30 + -8);
                  local_8d = *p_Var30;
                  pSVar20 = (self->iterators).contents;
                  puVar41 = (undefined8 *)((long)&pSVar20->node + local_70);
                  local_58.contents = (Subtree *)*puVar41;
                  uVar31 = puVar41[1];
                  puVar41 = (undefined8 *)((long)&(pSVar20->subtrees).size + local_70);
                  local_48 = *puVar41;
                  uStack_40 = puVar41[1];
                  local_58.size = (uint32_t)uVar31;
                  local_58.capacity = (uint32_t)((ulong)uVar31 >> 0x20);
                  uVar18 = (self->iterators).capacity;
                  if ((self->iterators).size != uVar18) {
LAB_00130407:
                    self = local_78;
                    pSVar20 = (local_78->iterators).contents;
                    uVar18 = (local_78->iterators).size;
                    (local_78->iterators).size = uVar18 + 1;
                    pSVar5 = pSVar20 + uVar18;
                    (pSVar5->subtrees).size = (undefined4)local_48;
                    (pSVar5->subtrees).capacity = local_48._4_4_;
                    *(undefined8 *)(&(pSVar5->subtrees).size + 2) = uStack_40;
                    pSVar20 = pSVar20 + uVar18;
                    pSVar20->node = (StackNode *)local_58.contents;
                    (pSVar20->subtrees).contents =
                         (Subtree *)CONCAT44(local_58.capacity,local_58.size);
                    uVar38 = (local_78->iterators).size;
                    if (uVar38 == 0) {
                      pSStack_a0 = (Stack *)0x1305b0;
                      __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                    ,0x151,
                                    "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                                   );
                    }
                    uVar18 = uVar38 - 1;
                    pSVar5 = (local_78->iterators).contents;
                    pSVar20 = pSVar5 + uVar18;
                    pSVar27 = &pSVar5[uVar18].subtrees;
                    pSStack_a0 = (Stack *)0x130460;
                    ts_subtree_array_copy(*pSVar27,pSVar27);
                    in_RDX = extraout_RDX_01;
                    goto LAB_00130460;
                  }
                  uVar26 = uVar18 * 2;
                  if (uVar26 < 9) {
                    uVar26 = 8;
                  }
                  if (uVar26 <= uVar18) goto LAB_00130407;
                  if (pSVar20 == (StackIterator *)0x0) {
                    pSStack_a0 = (Stack *)0x1303f1;
                    pSVar20 = (StackIterator *)calloc((ulong)uVar26,0x20);
                    if (pSVar20 != (StackIterator *)0x0) goto LAB_001303fa;
                  }
                  else {
                    pSStack_a0 = (Stack *)0x1303da;
                    pSVar20 = (StackIterator *)realloc(pSVar20,(ulong)uVar26 << 5);
                    if (pSVar20 != (StackIterator *)0x0) {
LAB_001303fa:
                      (local_78->iterators).contents = pSVar20;
                      (local_78->iterators).capacity = uVar26;
                      goto LAB_00130407;
                    }
LAB_001305df:
                    pSStack_a0 = (Stack *)0x1305e7;
                    ts_stack_pop_error_cold_2();
                  }
                  pSStack_a0 = (Stack *)0x1305ef;
                  ts_stack_pop_error_cold_3();
                  goto LAB_001305ef;
                }
LAB_00130515:
                uVar36 = (ulong)local_88->link_count;
                p_Var30 = p_Var30 + 0x18;
              } while (uVar35 < uVar36);
            }
            uVar36 = (ulong)((int)local_60 + 1);
            version = local_64;
            uVar18 = local_7c;
          }
        } while ((uint)uVar36 < uVar18);
        uVar18 = (self->iterators).size;
        uVar36 = 0;
      } while (uVar18 != 0);
    }
    uVar18 = (self->slices).size;
    pSVar19 = (Subtree *)(ulong)uVar18;
    bVar44 = uVar18 == 0;
    if (bVar44) goto LAB_001300b7;
    if (uVar18 != 1) {
LAB_00130613:
      pSStack_a0 = (Stack *)0x130632;
      __assert_fail("pop.size == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                    ,0x20c,"SubtreeArray ts_stack_pop_error(Stack *, StackVersion)");
    }
    pSVar6 = (self->slices).contents;
    pSStack_a0 = (Stack *)0x130585;
    ts_stack_renumber_version(self,pSVar6->version,version);
    pSVar19 = (pSVar6->subtrees).contents;
    in_RDX = *(Subtree **)&(pSVar6->subtrees).size;
  }
LAB_001300b7:
  if (bVar44) {
    in_RDX = (Subtree *)0x0;
    pSVar19 = (Subtree *)0x0;
  }
  SVar46._8_8_ = in_RDX;
  SVar46.contents = pSVar19;
  return SVar46;
LAB_00130bc8:
  lVar23 = __size[4];
  __size_01 = (long *)(uVar37 * 0x20);
  uVar39 = *(uint *)(lVar23 + 0x18 + (long)__size_01);
  uVar28 = (uint)uVar37;
  if (extraout_EDX < uVar39) {
LAB_00130eb8:
    ts_subtree_array_delete
              ((SubtreePool *)__size[9],(SubtreeArray *)((long *)(lVar23 + (long)__size_01) + 1));
    if (*(uint *)(__size + 5) <= uVar28) {
      __assert_fail("index < self->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                    ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
    }
    memmove((void *)((long)__size_01 + __size[4]),(void *)(uVar37 * 0x20 + __size[4] + 0x20),
            (ulong)(*(uint *)(__size + 5) + ~uVar28) << 5);
    *(int *)(__size + 5) = (int)__size[5] + -1;
    uVar26 = uVar26 - 1;
    uVar35 = extraout_RDX_04;
  }
  else {
    psVar7 = *(short **)(lVar23 + (long)__size_01);
    sVar2 = *psVar7;
    uVar18 = (pSVar21->padding).extent.row;
    lVar25 = (ulong)uVar18 * 0x14;
    do {
      if (lVar25 + -0x14 == -0x14) {
        uVar35 = 2;
        break;
      }
      uVar4 = *(uint *)(*(long *)pSVar21 + -8 + lVar25);
      if (uVar4 < uVar39) {
        uVar35 = 2;
        bVar44 = false;
      }
      else {
        bVar45 = *(short *)(*(long *)pSVar21 + -4 + lVar25) != sVar2;
        bVar44 = bVar45 || uVar4 != uVar39;
        uVar35 = (ulong)(!bVar45 && uVar4 == uVar39);
      }
      lVar25 = lVar25 + -0x14;
    } while (bVar44);
    if ((int)uVar35 == 2) {
      uVar4 = (pSVar21->padding).extent.column;
      if (uVar18 == uVar4) {
        uVar29 = uVar4 * 2;
        if (uVar29 < 9) {
          uVar29 = 8;
        }
        if (uVar4 < uVar29) {
          if (*(void **)pSVar21 == (void *)0x0) {
            uVar18 = 0x14;
            pvVar22 = calloc((ulong)uVar29,0x14);
            if (pvVar22 == (void *)0x0) {
              ts_stack_record_summary_cold_5();
LAB_00130fcc:
              ts_stack_record_summary_cold_6();
              if (*(uint *)(__size_01 + 1) <= uVar18) {
                __assert_fail("(uint32_t)version < (&self->heads)->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                              ,0x240,"StackSummary *ts_stack_get_summary(Stack *, StackVersion)");
              }
              SVar49.size = (int)extraout_RDX_05;
              SVar49.capacity = (int)((ulong)extraout_RDX_05 >> 0x20);
              SVar49.contents = *(Subtree **)(*__size_01 + 0x10 + (ulong)uVar18 * 0x28);
              return SVar49;
            }
          }
          else {
            pvVar22 = realloc(*(void **)pSVar21,(ulong)uVar29 * 0x14);
            if (pvVar22 == (void *)0x0) {
LAB_00130f94:
              ts_stack_record_summary_cold_2();
LAB_00130f9e:
              ts_stack_record_summary_cold_7();
LAB_00130fa3:
              __assert_fail("(uint32_t)version < (&self->heads)->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                            ,0x118,
                            "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                           );
            }
          }
          *(void **)pSVar21 = pvVar22;
          (pSVar21->padding).extent.column = uVar29;
        }
      }
      lVar25 = *(long *)pSVar21;
      uVar18 = (pSVar21->padding).extent.row;
      uVar43 = (ulong)uVar18;
      (pSVar21->padding).extent.row = uVar18 + 1;
      lVar8 = *(long *)(lVar23 + (long)__size_01);
      uVar31 = *(undefined8 *)(lVar8 + 4);
      uVar18 = *(uint *)(lVar8 + 0xc);
      uVar35 = (ulong)uVar18;
      *(uint *)(lVar25 + 8 + uVar43 * 0x14) = uVar18;
      *(undefined8 *)(lVar25 + uVar43 * 0x14) = uVar31;
      *(uint *)(lVar25 + 0xc + uVar43 * 0x14) = uVar39;
      *(short *)(lVar25 + 0x10 + uVar43 * 0x14) = sVar2;
    }
    if ((extraout_EDX < uVar39) || (psVar7[0x68] == 0)) goto LAB_00130eb8;
    uVar37 = (ulong)(ushort)psVar7[0x68];
    if (psVar7[0x68] != 0) {
      pbVar34 = (byte *)(psVar7 + 0x1c);
      uVar43 = 0;
      do {
        uVar43 = uVar43 + 1;
        if (uVar43 == uVar37) {
          uVar31 = *(undefined8 *)(psVar7 + 8);
          uVar37 = *(ulong *)(psVar7 + 0xc);
          bVar17 = *(byte *)(psVar7 + 0x10);
          puVar41 = (undefined8 *)(__size[4] + (long)__size_01);
LAB_00130e59:
          *puVar41 = uVar31;
          if (uVar37 == 0) {
            *(int *)(puVar41 + 3) = *(int *)(puVar41 + 3) + 1;
          }
          else {
            if ((uVar37 & 1) == 0) {
              uVar18 = *(uint *)(uVar37 + 0x2c) >> 2;
            }
            else {
              uVar18 = (uint)(uVar37 >> 3) & 0x1fffffff;
            }
            if (((uVar18 & 1) != 0) ||
               (*(int *)(puVar41 + 3) = *(int *)(puVar41 + 3) + 1, (bVar17 & 1) != 0))
            goto LAB_00130e91;
          }
          *(undefined1 *)((long)puVar41 + 0x1c) = 0;
        }
        else if (*(uint *)(__size + 5) < 0x40) {
          uVar31 = *(undefined8 *)(pbVar34 + -0x10);
          uVar37 = *(ulong *)(pbVar34 + -8);
          bVar17 = *pbVar34;
          pvVar22 = (void *)__size[4];
          uVar11 = *(undefined8 *)((long)pvVar22 + (long)__size_01);
          uVar12 = ((undefined8 *)((long)pvVar22 + (long)__size_01))[1];
          puVar41 = (undefined8 *)((long)pvVar22 + 0x10 + (long)__size_01);
          uVar13 = *puVar41;
          uVar14 = puVar41[1];
          uVar18 = *(uint *)((long)__size + 0x2c);
          if (*(uint *)(__size + 5) == uVar18) {
            uVar39 = uVar18 * 2;
            if (uVar39 < 9) {
              uVar39 = 8;
            }
            if (uVar18 < uVar39) {
              if (pvVar22 == (void *)0x0) {
                pvVar22 = calloc((ulong)uVar39,0x20);
                if (pvVar22 != (void *)0x0) goto LAB_00130de7;
              }
              else {
                pvVar22 = realloc(pvVar22,(ulong)uVar39 << 5);
                if (pvVar22 != (void *)0x0) {
LAB_00130de7:
                  __size[4] = (long)pvVar22;
                  *(uint *)((long)__size + 0x2c) = uVar39;
                  goto LAB_00130df3;
                }
                ts_stack_record_summary_cold_3();
              }
              ts_stack_record_summary_cold_4();
              goto LAB_00130f94;
            }
          }
LAB_00130df3:
          lVar23 = __size[4];
          uVar18 = *(uint *)(__size + 5);
          *(uint *)(__size + 5) = uVar18 + 1;
          lVar25 = (ulong)uVar18 * 0x20;
          puVar41 = (undefined8 *)(lVar23 + 0x10 + lVar25);
          *puVar41 = uVar13;
          puVar41[1] = uVar14;
          puVar41 = (undefined8 *)(lVar23 + lVar25);
          *puVar41 = uVar11;
          puVar41[1] = uVar12;
          if ((int)__size[5] == 0) {
            __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                          ,0x151,
                          "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                         );
          }
          lVar23 = (ulong)((int)__size[5] - 1) * 0x20;
          puVar41 = (undefined8 *)(__size[4] + lVar23);
          pSVar27 = (SubtreeArray *)(__size[4] + lVar23 + 8);
          ts_subtree_array_copy(*pSVar27,pSVar27);
          uVar35 = extraout_RDX_03;
          goto LAB_00130e59;
        }
LAB_00130e91:
        uVar37 = (ulong)(ushort)psVar7[0x68];
        pbVar34 = pbVar34 + 0x18;
      } while (uVar43 < uVar37);
    }
    uVar37 = (ulong)(uVar28 + 1);
  }
  if (uVar26 <= (uint)uVar37) {
    uVar26 = *(uint *)(__size + 5);
    uVar37 = 0;
    if (uVar26 == 0) {
LAB_00130f26:
      pSVar19 = (Subtree *)*__size;
      pSVar19[(uVar36 & 0xffffffff) * 5 + 2].ptr = pSVar21;
      SVar48.size = (int)uVar35;
      SVar48.capacity = (int)(uVar35 >> 0x20);
      SVar48.contents = pSVar19;
      return SVar48;
    }
  }
  goto LAB_00130bc8;
}

Assistant:

SubtreeArray ts_stack_pop_error(Stack *self, StackVersion version) {
  StackNode *node = array_get(&self->heads, version)->node;
  for (unsigned i = 0; i < node->link_count; i++) {
    if (node->links[i].subtree.ptr && ts_subtree_is_error(node->links[i].subtree)) {
      bool found_error = false;
      StackSliceArray pop = stack__iter(self, version, pop_error_callback, &found_error, 1);
      if (pop.size > 0) {
        assert(pop.size == 1);
        ts_stack_renumber_version(self, pop.contents[0].version, version);
        return pop.contents[0].subtrees;
      }
      break;
    }
  }
  return (SubtreeArray){.size = 0};
}